

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qcompleter.cpp
# Opt level: O2

void QCompleter::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined8 *puVar1;
  qsizetype qVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  bool bVar5;
  undefined4 uVar6;
  char cVar7;
  QString *prefix;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        activated((QCompleter *)_o,(QString *)_a[1]);
        return;
      }
      break;
    case 1:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        activated((QCompleter *)_o,(QModelIndex *)_a[1]);
        return;
      }
      break;
    case 2:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        highlighted((QCompleter *)_o,(QString *)_a[1]);
        return;
      }
      break;
    case 3:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        highlighted((QCompleter *)_o,(QModelIndex *)_a[1]);
        return;
      }
      break;
    case 4:
      prefix = (QString *)_a[1];
switchD_005d4ff6_caseD_0:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setCompletionPrefix((QCompleter *)_o,prefix);
        return;
      }
      break;
    case 5:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        complete((QCompleter *)_o,(QRect *)_a[1]);
        return;
      }
      break;
    case 6:
      local_38.d = (Data *)0x0;
      local_38.ptr = (char16_t *)0xffffffffffffffff;
      complete((QCompleter *)_o,(QRect *)&local_38);
      goto switchD_005d4f94_caseD_3;
    case 7:
      cVar7 = *_a[1];
LAB_005d5337:
      if (*(char *)(*(long *)(_o + 8) + 0xcc) != cVar7) {
        *(char *)(*(long *)(_o + 8) + 0xcc) = cVar7;
      }
      goto switchD_005d4f94_caseD_3;
    case 8:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QCompleterPrivate::_q_complete(*(QCompleterPrivate **)(_o + 8),*(QModelIndex *)_a[1],false);
        return;
      }
      break;
    case 9:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QCompleterPrivate::_q_completionSelected
                  (*(QCompleterPrivate **)(_o + 8),(QItemSelection *)_a[1]);
        return;
      }
      break;
    case 10:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QCompleterPrivate::_q_autoResizePopup(*(QCompleterPrivate **)(_o + 8));
        return;
      }
      break;
    case 0xb:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QCompleterPrivate::_q_fileSystemModelDirectoryLoaded
                  (*(QCompleterPrivate **)(_o + 8),(QString *)_a[1]);
        return;
      }
      break;
    default:
      goto switchD_005d4f94_caseD_3;
    }
    goto LAB_005d540c;
  case ReadProperty:
    if (8 < (uint)_id) break;
    puVar1 = (undefined8 *)*_a;
    switch(_id) {
    case 0:
      completionPrefix((QString *)&local_38,(QCompleter *)_o);
      pDVar3 = (Data *)*puVar1;
      pcVar4 = (char16_t *)puVar1[1];
      *puVar1 = local_38.d;
      puVar1[1] = local_38.ptr;
      qVar2 = puVar1[2];
      puVar1[2] = local_38.size;
      local_38.d = pDVar3;
      local_38.ptr = pcVar4;
      local_38.size = qVar2;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
      goto switchD_005d4f94_caseD_3;
    case 1:
      uVar6 = *(undefined4 *)(*(long *)(_o + 8) + 200);
      break;
    case 2:
      uVar6 = *(undefined4 *)(*(long *)(_o + 8) + 0x9c);
      break;
    case 3:
      uVar6 = *(undefined4 *)(*(long *)(_o + 8) + 0x98);
      break;
    case 4:
      uVar6 = *(undefined4 *)(*(long *)(_o + 8) + 0xc0);
      break;
    case 5:
      uVar6 = *(undefined4 *)(*(long *)(_o + 8) + 0xbc);
      break;
    case 6:
      uVar6 = *(undefined4 *)(*(long *)(_o + 8) + 0xc4);
      break;
    case 7:
      uVar6 = *(undefined4 *)(*(long *)(_o + 8) + 0xb8);
      break;
    case 8:
      *(undefined1 *)puVar1 = *(undefined1 *)(*(long *)(_o + 8) + 0xcc);
      goto switchD_005d4f94_caseD_3;
    }
    *(undefined4 *)puVar1 = uVar6;
    break;
  case WriteProperty:
    if ((uint)_id < 9) {
      prefix = (QString *)*_a;
      switch(_id) {
      case 0:
        goto switchD_005d4ff6_caseD_0;
      case 1:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setModelSorting((QCompleter *)_o,*(ModelSorting *)&(prefix->d).d);
          return;
        }
        break;
      case 2:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setFilterMode((QCompleter *)_o,
                        (QFlagsStorageHelper<Qt::MatchFlag,_4>)
                        *(QFlagsStorageHelper<Qt::MatchFlag,_4> *)&(prefix->d).d);
          return;
        }
        break;
      case 3:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setCompletionMode((QCompleter *)_o,*(CompletionMode *)&(prefix->d).d);
          return;
        }
        break;
      case 4:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setCompletionColumn((QCompleter *)_o,*(int *)&(prefix->d).d);
          return;
        }
        break;
      case 5:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setCompletionRole((QCompleter *)_o,*(int *)&(prefix->d).d);
          return;
        }
        break;
      case 6:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setMaxVisibleItems((QCompleter *)_o,*(int *)&(prefix->d).d);
          return;
        }
        break;
      case 7:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setCaseSensitivity((QCompleter *)_o,*(CaseSensitivity *)&(prefix->d).d);
          return;
        }
        break;
      case 8:
        cVar7 = *(char *)&(prefix->d).d;
        goto LAB_005d5337;
      }
      goto LAB_005d540c;
    }
    break;
  case IndexOfMethod:
    bVar5 = QtMocHelpers::indexOfMethod<void(QCompleter::*)(QString_const&)>
                      ((QtMocHelpers *)_a,(void **)activated,0,0);
    if (((!bVar5) &&
        (bVar5 = QtMocHelpers::indexOfMethod<void(QCompleter::*)(QModelIndex_const&)>
                           ((QtMocHelpers *)_a,(void **)activated,0,1), !bVar5)) &&
       (bVar5 = QtMocHelpers::indexOfMethod<void(QCompleter::*)(QString_const&)>
                          ((QtMocHelpers *)_a,(void **)highlighted,0,2), !bVar5)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QtMocHelpers::indexOfMethod<void(QCompleter::*)(QModelIndex_const&)>
                  ((QtMocHelpers *)_a,(void **)highlighted,0,3);
        return;
      }
      goto LAB_005d540c;
    }
  }
switchD_005d4f94_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_005d540c:
  __stack_chk_fail();
}

Assistant:

void QCompleter::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QCompleter *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->activated((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 1: _t->activated((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 2: _t->highlighted((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 3: _t->highlighted((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 4: _t->setCompletionPrefix((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 5: _t->complete((*reinterpret_cast< std::add_pointer_t<QRect>>(_a[1]))); break;
        case 6: _t->complete(); break;
        case 7: _t->setWrapAround((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 8: _t->d_func()->_q_complete((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 9: _t->d_func()->_q_completionSelected((*reinterpret_cast< std::add_pointer_t<QItemSelection>>(_a[1]))); break;
        case 10: _t->d_func()->_q_autoResizePopup(); break;
        case 11: _t->d_func()->_q_fileSystemModelDirectoryLoaded((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QCompleter::*)(const QString & )>(_a, &QCompleter::activated, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QCompleter::*)(const QModelIndex & )>(_a, &QCompleter::activated, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QCompleter::*)(const QString & )>(_a, &QCompleter::highlighted, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QCompleter::*)(const QModelIndex & )>(_a, &QCompleter::highlighted, 3))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QString*>(_v) = _t->completionPrefix(); break;
        case 1: *reinterpret_cast<ModelSorting*>(_v) = _t->modelSorting(); break;
        case 2: *reinterpret_cast<Qt::MatchFlags*>(_v) = _t->filterMode(); break;
        case 3: *reinterpret_cast<CompletionMode*>(_v) = _t->completionMode(); break;
        case 4: *reinterpret_cast<int*>(_v) = _t->completionColumn(); break;
        case 5: *reinterpret_cast<int*>(_v) = _t->completionRole(); break;
        case 6: *reinterpret_cast<int*>(_v) = _t->maxVisibleItems(); break;
        case 7: *reinterpret_cast<Qt::CaseSensitivity*>(_v) = _t->caseSensitivity(); break;
        case 8: *reinterpret_cast<bool*>(_v) = _t->wrapAround(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setCompletionPrefix(*reinterpret_cast<QString*>(_v)); break;
        case 1: _t->setModelSorting(*reinterpret_cast<ModelSorting*>(_v)); break;
        case 2: _t->setFilterMode(*reinterpret_cast<Qt::MatchFlags*>(_v)); break;
        case 3: _t->setCompletionMode(*reinterpret_cast<CompletionMode*>(_v)); break;
        case 4: _t->setCompletionColumn(*reinterpret_cast<int*>(_v)); break;
        case 5: _t->setCompletionRole(*reinterpret_cast<int*>(_v)); break;
        case 6: _t->setMaxVisibleItems(*reinterpret_cast<int*>(_v)); break;
        case 7: _t->setCaseSensitivity(*reinterpret_cast<Qt::CaseSensitivity*>(_v)); break;
        case 8: _t->setWrapAround(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}